

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll
          (ConfidentialTransaction *this,uint32_t tx_in_index)

{
  CfdException *this_00;
  reference this_01;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  int local_2c;
  wally_tx_witness_stack *pwStack_28;
  int ret;
  wally_tx_witness_stack *stack_pointer;
  wally_tx *tx_pointer;
  ConfidentialTransaction *pCStack_10;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  tx_pointer._4_4_ = tx_in_index;
  pCStack_10 = this;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x73c,"RemovePeginWitnessStackAll");
  stack_pointer = (wally_tx_witness_stack *)(this->super_AbstractTransaction).wally_tx_pointer_;
  if (((ulong)tx_pointer._4_4_ < stack_pointer->items_allocation_len) &&
     (*(long *)(stack_pointer->num_items + (ulong)tx_pointer._4_4_ * 0xd0 + 200) != 0)) {
    pwStack_28 = *(wally_tx_witness_stack **)
                  (stack_pointer->num_items + (ulong)tx_pointer._4_4_ * 0xd0 + 200);
    local_2c = wally_tx_witness_stack_free(pwStack_28);
    *(undefined8 *)(stack_pointer->num_items + (ulong)tx_pointer._4_4_ * 0xd0 + 200) = 0;
    if (local_2c != 0) {
      local_48.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_48.filename = local_48.filename + 1;
      local_48.line = 0x747;
      local_48.funcname = "RemovePeginWitnessStackAll";
      logger::warn<int&>(&local_48,"wally_tx_witness_stack_free NG[{}].",&local_2c);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_68,"pegin witness stack error.",&local_69);
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_68);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_2c = 0;
  }
  SetElementsTxState(this);
  this_01 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::operator[](&this->vin_,(ulong)tx_pointer._4_4_);
  ConfidentialTxIn::RemovePeginWitnessStackAll(this_01);
  return;
}

Assistant:

void ConfidentialTransaction::RemovePeginWitnessStackAll(
    uint32_t tx_in_index) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    if (tx_pointer->inputs[tx_in_index].pegin_witness != NULL) {
      struct wally_tx_witness_stack *stack_pointer;
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
      int ret = wally_tx_witness_stack_free(stack_pointer);
      tx_pointer->inputs[tx_in_index].pegin_witness = NULL;
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_free NG[{}].", ret);
        throw CfdException(
            kCfdIllegalStateError, "pegin witness stack error.");
      }
    }
  }
  SetElementsTxState();

  vin_[tx_in_index].RemovePeginWitnessStackAll();
}